

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O1

bool __thiscall HDFHDD::Open(HDFHDD *this,string *path,bool param_2)

{
  int iVar1;
  ssize_t sVar2;
  int64_t iVar3;
  long lVar4;
  undefined7 in_register_00000011;
  RS_IDE sHeader;
  undefined8 local_38;
  char cStack_30;
  ushort uStack_2f;
  undefined3 uStack_2d;
  undefined2 uStack_2a;
  undefined6 uStack_28;
  
  iVar1 = open64((path->_M_dataplus)._M_p,2,CONCAT71(in_register_00000011,param_2));
  (this->super_HDD).h = iVar1;
  if (iVar1 == -1) {
    iVar1 = open64((path->_M_dataplus)._M_p,0);
    (this->super_HDD).h = iVar1;
    if (iVar1 == -1) {
      return false;
    }
  }
  local_38 = 0;
  cStack_30 = '\0';
  uStack_2f = 0;
  uStack_2d = 0;
  uStack_2a = 0;
  uStack_28 = 0;
  sVar2 = read((this->super_HDD).h,&local_38,0x16);
  if ((sVar2 == 0x16) && (cStack_30 == '\0')) {
    if (local_38._4_2_ == 0x4544 && (int)local_38 == 0x492d5352) {
      (this->super_HDD).data_offset = (uint)uStack_2f;
      iVar1 = 0x200;
      if (uStack_2f < 0x217) {
        iVar1 = uStack_2f - 0x16;
      }
      (this->super_HDD).sIdentify.len = iVar1;
      sVar2 = read((this->super_HDD).h,&(this->super_HDD).sIdentify.field_1,(long)iVar1);
      if (sVar2 == (this->super_HDD).sIdentify.len) {
        (this->super_HDD).sector_size = 0x200;
        iVar3 = FileSize(path);
        lVar4 = iVar3 - (this->super_HDD).data_offset;
        (this->super_HDD).total_bytes = lVar4;
        (this->super_HDD).total_sectors = lVar4 / (long)(this->super_HDD).sector_size & 0xffffffff;
        HDD::SetIdentifyData(&this->super_HDD,&(this->super_HDD).sIdentify);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool HDFHDD::Open(const std::string& path, bool /*uncached*/)
{
    // Open as read-write, falling back on read-only
    if ((h = open(path.c_str(), O_RDWR | O_BINARY)) == -1 &&
        (h = open(path.c_str(), O_RDONLY | O_BINARY)) == -1)
        return false;

    RS_IDE sHeader = {};

    // Read the header and check for signature
    if (read(h, &sHeader, sizeof(sHeader)) == sizeof(sHeader) && !sHeader.bFlags &&
        !memcmp(sHeader.szSignature, "RS-IDE", sizeof(sHeader.szSignature)))
    {
        // Read start of sector data, and determine identify length from that
        data_offset = (sHeader.bOffsetHigh << 8) | sHeader.bOffsetLow;
        sIdentify.len = data_offset - sizeof(sHeader);

        // Limit identify data size to a single sector
        if (sIdentify.len > SECTOR_SIZE)
            sIdentify.len = SECTOR_SIZE;

        // Read the identify data from the image
        if (read(h, sIdentify.byte, sIdentify.len) == static_cast<int>(sIdentify.len))
        {
            // Sector size is fixed at 512 bytes
            sector_size = SECTOR_SIZE;

            // Byte and sector counts are taken from the file size (excluding the header)
            total_bytes = FileSize(path) - data_offset;
            total_sectors = static_cast<unsigned>(total_bytes / sector_size);

            // Update CHS from the identify data
            SetIdentifyData(&sIdentify);

            return true;
        }
    }

    return false;
}